

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

double ChickenHook::log(double __x)

{
  code *pcVar1;
  char in_AL;
  int iVar2;
  char *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  string res;
  va_list argptr;
  string local_128;
  long *local_108 [2];
  long local_f8 [2];
  __va_list_tag local_e8;
  undefined1 local_c8 [48];
  double local_98;
  
  if (in_AL != '\0') {
    local_98 = __x;
  }
  if ((in_RDI != (char *)0x0) && (logFunction_abi_cxx11_ != (code *)0x0)) {
    local_e8.reg_save_area = local_c8;
    local_e8.overflow_arg_area = &res._M_string_length;
    local_e8.gp_offset = 8;
    local_e8.fp_offset = 0x30;
    local_128._M_string_length = 0;
    local_128.field_2._M_local_buf[0] = '\0';
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    iVar2 = vaListToString(in_RDI,&local_e8,&local_128);
    pcVar1 = logFunction_abi_cxx11_;
    __x = extraout_XMM0_Qa;
    if (0 < iVar2) {
      local_108[0] = local_f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_108,local_128._M_dataplus._M_p,
                 local_128._M_dataplus._M_p + local_128._M_string_length);
      __x = (double)(*pcVar1)(local_108);
      if (local_108[0] != local_f8) {
        operator_delete(local_108[0],local_f8[0] + 1);
        __x = extraout_XMM0_Qa_00;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,
                      CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                               local_128.field_2._M_local_buf[0]) + 1);
      __x = extraout_XMM0_Qa_01;
    }
  }
  return __x;
}

Assistant:

void log(const char *CFormatString, ...) {

        if (CFormatString == nullptr) {
            return;
        }

        if (logFunction == NULL) {
            return;
        }

        va_list argptr;
        va_start(argptr, CFormatString);
        std::string res;
        int len = vaListToString(CFormatString, argptr, res);
        if (len > 0) {
            (*logFunction)(res);
        }
        va_end(argptr);

    }